

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O3

void lj_ir_rollback(jit_State *J,IRRef ref)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  IRIns *pIVar4;
  ulong uVar5;
  
  uVar3 = (J->cur).nins;
  uVar5 = (ulong)uVar3;
  if (ref < uVar3) {
    pIVar4 = (J->cur).ir;
    do {
      lVar1 = uVar5 * 8;
      lVar2 = uVar5 * 8;
      uVar5 = uVar5 - 1;
      J->chain[*(byte *)((long)pIVar4 + lVar2 + -3)] = *(IRRef1 *)((long)pIVar4 + lVar1 + -2);
    } while (ref < uVar5);
  }
  (J->cur).nins = (IRRef)uVar5;
  return;
}

Assistant:

void lj_ir_rollback(jit_State *J, IRRef ref)
{
  IRRef nins = J->cur.nins;
  while (nins > ref) {
    IRIns *ir;
    nins--;
    ir = IR(nins);
    J->chain[ir->o] = ir->prev;
  }
  J->cur.nins = nins;
}